

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status pugi::impl::anon_unknown_0::convert_file_size<long>(long length,size_t *out_result)

{
  size_t result;
  size_t *out_result_local;
  long length_local;
  undefined4 local_4;
  
  if (length < 0) {
    local_4 = status_io_error;
  }
  else {
    *out_result = length;
    local_4 = status_ok;
  }
  return local_4;
}

Assistant:

PUGI_IMPL_FN xml_parse_status convert_file_size(T length, size_t& out_result)
	{
		// check for I/O errors
		if (length < 0) return status_io_error;

		// check for overflow
		size_t result = static_cast<size_t>(length);

		if (static_cast<T>(result) != length) return status_out_of_memory;

		out_result = result;
		return status_ok;
	}